

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gguf.cpp
# Opt level: O2

uint32_t gguf_get_val_u32(gguf_context *ctx,int64_t key_id)

{
  pointer pgVar1;
  size_t sVar2;
  uint *puVar3;
  char *pcVar4;
  int line;
  
  if (-1 < key_id) {
    pgVar1 = (ctx->kv).super__Vector_base<gguf_kv,_std::allocator<gguf_kv>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (key_id < ((long)(ctx->kv).super__Vector_base<gguf_kv,_std::allocator<gguf_kv>_>._M_impl.
                        super__Vector_impl_data._M_finish - (long)pgVar1) / 0x58) {
      sVar2 = gguf_kv::get_ne(pgVar1 + key_id);
      if (sVar2 == 1) {
        puVar3 = gguf_kv::get_val<unsigned_int>
                           ((ctx->kv).super__Vector_base<gguf_kv,_std::allocator<gguf_kv>_>._M_impl.
                            super__Vector_impl_data._M_start + key_id,0);
        return *puVar3;
      }
      pcVar4 = "ctx->kv[key_id].get_ne() == 1";
      line = 0x33c;
      goto LAB_0013f19c;
    }
  }
  pcVar4 = "key_id >= 0 && key_id < gguf_get_n_kv(ctx)";
  line = 0x33b;
LAB_0013f19c:
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]llama/ggml/src/gguf.cpp"
             ,line,"GGML_ASSERT(%s) failed",pcVar4);
}

Assistant:

uint32_t gguf_get_val_u32(const struct gguf_context * ctx, int64_t key_id) {
    GGML_ASSERT(key_id >= 0 && key_id < gguf_get_n_kv(ctx));
    GGML_ASSERT(ctx->kv[key_id].get_ne() == 1);
    return ctx->kv[key_id].get_val<uint32_t>();
}